

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_bot.cpp
# Opt level: O3

void Cmd_listbots(FCommandLine *argv,APlayerPawn *who,int key)

{
  char *pcVar1;
  uint uVar2;
  botinfo_t *pbVar3;
  
  if (bglobal.botinfo == (botinfo_t *)0x0) {
    uVar2 = 0;
  }
  else {
    uVar2 = 0;
    pbVar3 = bglobal.botinfo;
    do {
      pcVar1 = "";
      if (pbVar3->inuse == 2) {
        pcVar1 = " (active)";
      }
      Printf("%s%s\n",pbVar3->name,pcVar1);
      uVar2 = uVar2 + 1;
      pbVar3 = pbVar3->next;
    } while (pbVar3 != (botinfo_t *)0x0);
  }
  Printf("> %d bots\n",(ulong)uVar2);
  return;
}

Assistant:

CCMD (listbots)
{
	botinfo_t *thebot = bglobal.botinfo;
	int count = 0;

	while (thebot)
	{
		Printf ("%s%s\n", thebot->name, thebot->inuse == BOTINUSE_Yes ? " (active)" : "");
		thebot = thebot->next;
		count++;
	}
	Printf ("> %d bots\n", count);
}